

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.c
# Opt level: O2

void Tags_delete(Tags *tags)

{
  long lVar1;
  wchar_t i;
  long lVar2;
  
  if (tags != (Tags *)0x0) {
    if (tags->tags != (Tag *)0x0) {
      lVar1 = 0;
      for (lVar2 = 0; lVar2 < tags->tag_count; lVar2 = lVar2 + 1) {
        delete_tag_content((Tag *)((long)&tags->tags->tag_delete + lVar1));
        lVar1 = lVar1 + 0x28;
      }
      free(tags->tags);
    }
    free(tags);
    return;
  }
  return;
}

Assistant:

void Tags_delete(const Tags* tags) {
    if (!tags) {
        return;
    }
    if (tags->tags) {
        int i;
        for(i = 0; i < tags->tag_count; ++i) {
            delete_tag_content(tags->tags + i);
        }
        free((void*)tags->tags);
    }
    free((void*)tags);
}